

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_target.cc
# Opt level: O1

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringPieceInputFileFactory factory;
  string local_48;
  InputFileFactory local_28;
  size_t local_20;
  uint8_t *local_18;
  
  local_28._vptr_InputFileFactory = (_func_int **)&PTR__InputFileFactory_005dbe70;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  local_20 = size;
  local_18 = data;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"segments","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"sections","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"symbols","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"compileunits","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"inlines","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"armembers","");
  bloaty::RunBloaty(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int LLVMFuzzerTestOneInput(const uint8_t *data, size_t size) {
  const char *data2 = reinterpret_cast<const char*>(data);
  bloaty::StringPieceInputFileFactory factory(string_view(data2, size));

  // Try all of the data sources.
  RunBloaty(factory, "segments");
  RunBloaty(factory, "sections");
  RunBloaty(factory, "symbols");
  RunBloaty(factory, "compileunits");
  RunBloaty(factory, "inlines");
  RunBloaty(factory, "armembers");

  return 0;
}